

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::repr(string *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pcVar1 = (str->_M_dataplus)._M_p;
  pcVar3 = pcVar1;
  do {
    if (pcVar3 == pcVar1 + str->_M_string_length) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    cVar2 = *pcVar3;
    if (cVar2 == '\t') {
LAB_00109165:
      cVar2 = '\x04' - (char)__return_storage_ptr__->_M_string_length;
      if (__return_storage_ptr__->_M_string_length == 4) {
        cVar2 = '\x04';
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,cVar2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_50);
    }
    else if (cVar2 == '\n') {
LAB_001091be:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (cVar2 == '\r') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        goto LAB_00109165;
      }
      if (((cVar2 == '\"') || (cVar2 == '\'')) || (cVar2 == '\\')) goto LAB_001091be;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar3 = pcVar3 + 1;
    pcVar1 = (str->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

string repr(string str) {
    string result;
    result += "\'";

    for (auto it = str.begin(); it != str.end(); ++it) {
        int temp_int;
        switch(*it) {
        case '\\':
            result += "\\\\";
            break;
        case '\'':
            result += "\\\'";
            break;
        case '\"':
            result += "\\\"";
            break;
        case '\n':
            result += "\\n";
            break;
        case '\r':
            result += "\\r";
        case '\t':
            temp_int = (4 - result.size())?(4 - result.size()):4;
            result += string(temp_int, ' ');
            break;
        default:
            result += *it;
            break;
        }
    }

    result += "\'";
    return result;
}